

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * base64_encode_abi_cxx11_
                   (string *__return_storage_ptr__,uchar *bytes_to_encode,size_t in_len)

{
  uchar uVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    uVar3 = 0;
    do {
      bVar6 = in_len == 0;
      in_len = in_len - 1;
      cVar2 = (char)__return_storage_ptr__;
      if (bVar6) {
        uVar5 = uVar3;
        if (uVar3 != 0) {
          for (; uVar5 < 3; uVar5 = uVar5 + 1) {
            char_array_3[uVar5] = '\0';
          }
          for (uVar5 = 0; uVar5 <= uVar3; uVar5 = uVar5 + 1) {
            std::__cxx11::string::push_back(cVar2);
          }
          uVar3 = uVar3 - 1;
          while (uVar3 = uVar3 + 1, uVar3 < 3) {
            std::__cxx11::string::push_back(cVar2);
          }
        }
        return __return_storage_ptr__;
      }
      uVar1 = *bytes_to_encode;
      bytes_to_encode = bytes_to_encode + 1;
      char_array_3[uVar3] = uVar1;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 3);
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      std::__cxx11::string::push_back(cVar2);
    }
  } while( true );
}

Assistant:

std::string base64_encode(const unsigned char* bytes_to_encode, std::size_t in_len) {
		std::string ret;
		std::size_t i = 0;
		std::size_t j = 0;

		unsigned char char_array_3[3];
		unsigned char char_array_4[4];

		while (in_len--) {
			char_array_3[i++] = *(bytes_to_encode++);
			if (i == 3) {
				char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
				char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
				char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
				char_array_4[3] = char_array_3[2] & 0x3f;

				for (i = 0; (i < 4); i++)
					ret += base64_chars[char_array_4[i]];
				i = 0;
			}
		}

		if (i)
		{
			for (j = i; j < 3; j++)
				char_array_3[j] = '\0';

			char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
			char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
			char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);

			for (j = 0; (j < i + 1); j++)
				ret += base64_chars[char_array_4[j]];

			while ((i++ < 3))
				ret += '=';

		}
		return ret;
	}